

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_cosine_transform.cc
# Opt level: O1

void __thiscall
sptk::DiscreteCosineTransform::DiscreteCosineTransform(DiscreteCosineTransform *this,int dct_length)

{
  double __x;
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  
  this->_vptr_DiscreteCosineTransform = (_func_int **)&PTR__DiscreteCosineTransform_001186b8;
  this->dct_length_ = dct_length;
  FourierTransform::FourierTransform(&this->fourier_transform_,dct_length * 2);
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[3])();
  if ((char)iVar3 != '\0') {
    iVar3 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[2])()
    ;
    __x = (double)iVar3;
    if (__x < 0.0) {
      dVar5 = sqrt(__x);
    }
    else {
      dVar5 = SQRT(__x);
    }
    std::vector<double,_std::allocator<double>_>::resize
              (&this->cosine_table_,(long)this->dct_length_);
    std::vector<double,_std::allocator<double>_>::resize(&this->sine_table_,(long)this->dct_length_)
    ;
    dVar5 = 1.0 / dVar5;
    *(this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_start = dVar5 / 1.4142135623730951;
    *(this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_start = 0.0;
    if (1 < this->dct_length_) {
      lVar4 = 1;
      do {
        dVar1 = (double)(int)lVar4 * (3.141592653589793 / __x);
        dVar2 = cos(dVar1);
        (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4] = dVar2 * dVar5;
        dVar1 = sin(dVar1);
        (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4] = -dVar1 * dVar5;
        lVar4 = lVar4 + 1;
      } while (lVar4 < this->dct_length_);
    }
  }
  return;
}

Assistant:

DiscreteCosineTransform::DiscreteCosineTransform(int dct_length)
    : dct_length_(dct_length), fourier_transform_(2 * dct_length_) {
  if (!fourier_transform_.IsValid()) {
    return;
  }

  const int dft_length(fourier_transform_.GetLength());
  const double argument(sptk::kPi / dft_length);
  const double c(1.0 / std::sqrt(dft_length));
  cosine_table_.resize(dct_length_);
  sine_table_.resize(dct_length_);
  cosine_table_[0] = c / std::sqrt(2.0);
  sine_table_[0] = 0.0;
  for (int i(1); i < dct_length_; ++i) {
    cosine_table_[i] = std::cos(argument * i) * c;
    sine_table_[i] = -std::sin(argument * i) * c;
  }
}